

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedFieldRefIterator<double>::RepeatedFieldRefIterator
          (RepeatedFieldRefIterator<double> *this,void *data,RepeatedFieldAccessor *accessor,
          bool begin)

{
  void *pvVar1;
  double *pdVar2;
  undefined3 in_register_00000009;
  
  this->data_ = data;
  this->accessor_ = accessor;
  if (CONCAT31(in_register_00000009,begin) == 0) {
    pvVar1 = (void *)(**(code **)(*(long *)accessor + 0x50))(accessor);
    this->iterator_ = pvVar1;
    pdVar2 = (double *)0x0;
  }
  else {
    pvVar1 = (void *)(**(code **)(*(long *)accessor + 0x48))();
    this->iterator_ = pvVar1;
    pdVar2 = (double *)operator_new(8);
  }
  (this->scratch_space_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar2;
  return;
}

Assistant:

RepeatedFieldRefIterator(
      const void* PROTOBUF_NONNULL data,
      const RepeatedFieldAccessor* PROTOBUF_NONNULL accessor, bool begin)
      : data_(data),
        accessor_(accessor),
        iterator_(begin ? accessor->BeginIterator(data)
                        : accessor->EndIterator(data)),
        // The end iterator must not be dereferenced, no need for scratch space.
        scratch_space_(begin ? new AccessorValueType : nullptr) {}